

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O0

cmStateSnapshot * __thiscall
cmStateSnapshot::GetCallStackParent(cmStateSnapshot *__return_storage_ptr__,cmStateSnapshot *this)

{
  PositionType position;
  bool bVar1;
  PointerType pSVar2;
  cmStateSnapshot local_58;
  iterator local_40;
  undefined1 local_30 [8];
  PositionType parentPos;
  cmStateSnapshot *this_local;
  
  if (this->State == (cmState *)0x0) {
    __assert_fail("this->State",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmStateSnapshot.cxx"
                  ,0x5a,"cmStateSnapshot cmStateSnapshot::GetCallStackParent() const");
  }
  join_0x00000010_0x00000000_ =
       cmLinkedTree<cmStateDetail::SnapshotDataType>::Root(&this->State->SnapshotData);
  bVar1 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator!=
                    (&this->Position,join_0x00000010_0x00000000_);
  if (bVar1) {
    cmStateSnapshot(__return_storage_ptr__,(cmState *)0x0);
    local_30 = (undefined1  [8])(this->Position).Tree;
    parentPos.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(this->Position).Position;
    while( true ) {
      pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         ((iterator *)local_30);
      bVar1 = true;
      if (pSVar2->SnapshotType != PolicyScopeType) {
        pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                           ((iterator *)local_30);
        bVar1 = pSVar2->SnapshotType == VariableScopeType;
      }
      if (!bVar1) break;
      cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator++((iterator *)local_30);
    }
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                       ((iterator *)local_30);
    if ((pSVar2->SnapshotType != BuildsystemDirectoryType) &&
       (pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                           ((iterator *)local_30), pSVar2->SnapshotType != BaseType)) {
      cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator++((iterator *)local_30);
      while( true ) {
        pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                           ((iterator *)local_30);
        bVar1 = true;
        if (pSVar2->SnapshotType != PolicyScopeType) {
          pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                             ((iterator *)local_30);
          bVar1 = pSVar2->SnapshotType == VariableScopeType;
        }
        if (!bVar1) break;
        cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator++((iterator *)local_30);
      }
      local_40 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Root(&this->State->SnapshotData);
      bVar1 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator==
                        ((iterator *)local_30,local_40);
      if (!bVar1) {
        position.Position = (PositionType)parentPos.Tree;
        position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_30;
        cmStateSnapshot(&local_58,this->State,position);
        __return_storage_ptr__->State = local_58.State;
        (__return_storage_ptr__->Position).Tree = local_58.Position.Tree;
        (__return_storage_ptr__->Position).Position = local_58.Position.Position;
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("this->Position != this->State->SnapshotData.Root()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmStateSnapshot.cxx"
                ,0x5b,"cmStateSnapshot cmStateSnapshot::GetCallStackParent() const");
}

Assistant:

cmStateSnapshot cmStateSnapshot::GetCallStackParent() const
{
  assert(this->State);
  assert(this->Position != this->State->SnapshotData.Root());

  cmStateSnapshot snapshot;
  cmStateDetail::PositionType parentPos = this->Position;
  while (parentPos->SnapshotType == cmStateEnums::PolicyScopeType ||
         parentPos->SnapshotType == cmStateEnums::VariableScopeType) {
    ++parentPos;
  }
  if (parentPos->SnapshotType == cmStateEnums::BuildsystemDirectoryType ||
      parentPos->SnapshotType == cmStateEnums::BaseType) {
    return snapshot;
  }

  ++parentPos;
  while (parentPos->SnapshotType == cmStateEnums::PolicyScopeType ||
         parentPos->SnapshotType == cmStateEnums::VariableScopeType) {
    ++parentPos;
  }

  if (parentPos == this->State->SnapshotData.Root()) {
    return snapshot;
  }

  snapshot = cmStateSnapshot(this->State, parentPos);
  return snapshot;
}